

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O3

int big_file_create(BigFile *bf,char *basename)

{
  int iVar1;
  char *__dest;
  int iVar2;
  size_t __n;
  
  __n = 0;
  do {
    if (basename[__n] == '\0') goto LAB_00102c76;
    __n = __n + 1;
  } while (__n != 0x2000);
  __n = 0x2000;
LAB_00102c76:
  __dest = (char *)malloc(__n + 1);
  strncpy(__dest,basename,__n);
  __dest[__n] = '\0';
  bf->basename = __dest;
  iVar2 = 0;
  iVar1 = _big_file_mksubdir_r((char *)0x0,basename);
  if (iVar1 != 0) {
    _big_file_raise((char *)0x0,
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0xc9);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int big_file_create(BigFile * bf, const char * basename) {
    bf->basename = _strdup(basename);
    RAISEIF(0 != _big_file_mksubdir_r(NULL, basename),
        ex_subdir,
        NULL);
    return 0;
ex_subdir:
    return -1;
}